

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogButtons(void)

{
  ImVector<unsigned_int> *pIVar1;
  int *v;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ImVec2 local_30;
  
  pIVar2 = GImGui;
  PushID("LogButtons");
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar3 = Button("Log To TTY",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar4 = Button("Log To File",&local_30);
  SameLine(0.0,-1.0);
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar5 = Button("Log To Clipboard",&local_30);
  SameLine(0.0,-1.0);
  PushItemWidth(80.0);
  PushAllowKeyboardFocus(false);
  v = &pIVar2->LogAutoExpandMaxDepth;
  SliderInt("Depth",v,0,9,(char *)0x0);
  PopItemFlag();
  PopItemWidth();
  pIVar1 = &GImGui->CurrentWindow->IDStack;
  pIVar1->Size = pIVar1->Size + -1;
  if (bVar3) {
    LogToTTY(*v);
  }
  if (bVar4) {
    LogToFile(pIVar2->LogAutoExpandMaxDepth,(pIVar2->IO).LogFilename);
  }
  if (bVar5) {
    LogToClipboard(*v);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
    const bool log_to_tty = Button("Log To TTY"); SameLine();
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushItemWidth(80.0f);
    PushAllowKeyboardFocus(false);
    SliderInt("Depth", &g.LogAutoExpandMaxDepth, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopItemWidth();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY(g.LogAutoExpandMaxDepth);
    if (log_to_file)
        LogToFile(g.LogAutoExpandMaxDepth, g.IO.LogFilename);
    if (log_to_clipboard)
        LogToClipboard(g.LogAutoExpandMaxDepth);
}